

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
perfetto::protos::gen::FreeBuffersResponse::SerializeAsArray
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          FreeBuffersResponse *this)

{
  uint8_t *puVar1;
  uint uVar2;
  uint8_t *src;
  uint8_t *end;
  ulong size;
  HeapBuffered<protozero::Message> msg;
  HeapBuffered<protozero::Message> local_e0;
  
  protozero::HeapBuffered<protozero::Message>::HeapBuffered(&local_e0,0x1000,0x1000);
  src = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  uVar2 = (uint)(this->unknown_fields_)._M_string_length;
  size = (ulong)uVar2;
  puVar1 = (local_e0.msg_.super_Message.stream_writer_)->write_ptr_ + size;
  if (((local_e0.msg_.super_Message.stream_writer_)->cur_range_).end < puVar1) {
    protozero::ScatteredStreamWriter::WriteBytesSlowPath
              (local_e0.msg_.super_Message.stream_writer_,src,size);
  }
  else {
    memcpy((local_e0.msg_.super_Message.stream_writer_)->write_ptr_,src,size);
    (local_e0.msg_.super_Message.stream_writer_)->write_ptr_ = puVar1;
  }
  local_e0.msg_.super_Message.size_ = local_e0.msg_.super_Message.size_ + uVar2;
  protozero::Message::Finalize(&local_e0.msg_.super_Message);
  protozero::ScatteredHeapBuffer::StitchSlices(__return_storage_ptr__,&local_e0.shb_);
  protozero::MessageArena::~MessageArena(&local_e0.msg_.root_arena_);
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&local_e0.writer_);
  protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&local_e0.shb_);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> FreeBuffersResponse::SerializeAsArray() const {
  ::protozero::HeapBuffered<::protozero::Message> msg;
  Serialize(msg.get());
  return msg.SerializeAsArray();
}